

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

int main(void)

{
  int iVar1;
  uint local_10;
  int ret;
  
  xmlCheckVersion(0x5398);
  iVar1 = testall_dict();
  if (iVar1 != 0) {
    fprintf(_stderr,"dictionary tests failed\n");
  }
  local_10 = (uint)(iVar1 != 0);
  iVar1 = testall_hash();
  if (iVar1 != 0) {
    fprintf(_stderr,"hash tests failed\n");
    local_10 = 1;
  }
  xmlCleanupParser();
  return local_10;
}

Assistant:

int
main(void) {
    int ret = 0;

    LIBXML_TEST_VERSION

    if (testall_dict() != 0) {
        fprintf(stderr, "dictionary tests failed\n");
        ret = 1;
    }
    if (testall_hash() != 0) {
        fprintf(stderr, "hash tests failed\n");
        ret = 1;
    }

    xmlCleanupParser();
    return(ret);
}